

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cc
# Opt level: O3

Status __thiscall util::fs::FileLock::acquire(FileLock *this,string *filename)

{
  string *psVar1;
  pointer pcVar2;
  int iVar3;
  int *piVar4;
  Status SVar5;
  undefined1 local_220 [8];
  ofstream touch;
  undefined1 local_210 [8];
  uint local_208;
  int aiStack_200 [54];
  ios_base local_128 [264];
  
  pcVar2 = (filename->_M_dataplus)._M_p;
  local_220 = (undefined1  [8])local_210;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_220,pcVar2,pcVar2 + filename->_M_string_length);
  std::__cxx11::string::append((char *)local_220);
  std::__cxx11::string::operator=((string *)this,(string *)local_220);
  if (local_220 != (undefined1  [8])local_210) {
    operator_delete((void *)local_220);
  }
  psVar1 = &this->reason;
  (this->reason)._M_string_length = 0;
  *(this->reason)._M_dataplus._M_p = '\0';
  iVar3 = stat((this->lockfile)._M_dataplus._M_p,(stat *)local_220);
  if ((iVar3 < 0) || ((local_208 & 0xf000) != 0x8000)) {
    std::ofstream::ofstream(local_220,(this->lockfile)._M_dataplus._M_p,_S_bin);
    if (*(int *)((long)aiStack_200 + *(long *)((long)local_220 + -0x18)) == 0) {
      SVar5 = LOCK_CREATED;
      std::ofstream::close();
    }
    else {
      std::__cxx11::string::_M_replace
                ((ulong)psVar1,0,(char *)(this->reason)._M_string_length,0x11b377);
      piVar4 = __errno_location();
      strerror(*piVar4);
      SVar5 = LOCK_CREATE_ERROR;
      std::__cxx11::string::append((char *)psVar1);
    }
    local_220 = (undefined1  [8])_VTT;
    *(undefined8 *)(local_220 + *(long *)(_VTT - 0x18)) = ___throw_bad_array_new_length;
    std::filebuf::~filebuf((filebuf *)&touch);
    std::ios_base::~ios_base(local_128);
  }
  else {
    std::__cxx11::string::_M_replace
              ((ulong)psVar1,0,(char *)(this->reason)._M_string_length,0x11b360);
    SVar5 = LOCK_EXISTS;
  }
  return SVar5;
}

Assistant:

FileLock::Status
FileLock::acquire (std::string const& filename)
{
    /* Check if lock file exists. */
    this->lockfile = filename + ".lock";
    this->reason.clear();
    if (fs::file_exists(this->lockfile.c_str()))
    {
        this->reason = "Previous lock existing";
        return FileLock::LOCK_EXISTS;
    }

    /* Finally create the lock file. */
    std::ofstream touch(this->lockfile.c_str(), std::ios::binary);
    if (!touch.good())
    {
        this->reason = "Error locking: ";
        this->reason += std::strerror(errno);
        return FileLock::LOCK_CREATE_ERROR;
    }
    touch.close();

    /* Return success, lock is created. */
    return FileLock::LOCK_CREATED;
}